

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_11x11(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  JSAMPROW pJVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  int *piVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  int *local_f8;
  int local_98 [8];
  int local_78 [8];
  int aiStack_58 [10];
  
  uVar13 = (ulong)start_col;
  lVar18 = 0;
  local_f8 = data;
  do {
    pJVar12 = sample_data[lVar18];
    uVar27 = (uint)pJVar12[uVar13] + (uint)pJVar12[uVar13 + 10];
    uVar22 = (uint)pJVar12[uVar13 + 1] + (uint)pJVar12[uVar13 + 9];
    uVar25 = (uint)pJVar12[uVar13 + 2] + (uint)pJVar12[uVar13 + 8];
    uVar32 = (uint)pJVar12[uVar13 + 3] + (uint)pJVar12[uVar13 + 7];
    lVar30 = (ulong)pJVar12[uVar13] - (ulong)pJVar12[uVar13 + 10];
    lVar34 = (ulong)pJVar12[uVar13 + 1] - (ulong)pJVar12[uVar13 + 9];
    lVar19 = (ulong)pJVar12[uVar13 + 2] - (ulong)pJVar12[uVar13 + 8];
    uVar14 = (uint)pJVar12[uVar13 + 4] + (uint)pJVar12[uVar13 + 6];
    bVar1 = pJVar12[uVar13 + 5];
    lVar21 = (ulong)pJVar12[uVar13 + 3] - (ulong)pJVar12[uVar13 + 7];
    lVar31 = (ulong)pJVar12[uVar13 + 4] - (ulong)pJVar12[uVar13 + 6];
    *local_f8 = (uVar32 + uVar25 + uVar22 + uVar27 + (uint)bVar1 + uVar14) * 2 + -0xb00;
    uVar24 = (ulong)((uint)bVar1 + (uint)bVar1);
    lVar28 = uVar27 - uVar24;
    lVar23 = uVar22 - uVar24;
    lVar26 = uVar25 - uVar24;
    lVar33 = uVar32 - uVar24;
    lVar15 = uVar14 - uVar24;
    lVar29 = (lVar26 + lVar15) * 0x671 + (lVar28 + lVar33) * 0x2b6c;
    lVar17 = (lVar23 - lVar33) * 0x1da3;
    local_f8[2] = (int)(lVar15 * 0xfffffffd37d + lVar33 * 0xfffffffdf6a + lVar17 + lVar29 + 0x800U
                       >> 0xc);
    lVar33 = (lVar28 - lVar23) * 0x2612;
    local_f8[4] = (int)((ulong)(lVar26 * 0xfffffffd494 + lVar15 * 0x12cd + lVar17 +
                               lVar23 * 0x1ff + lVar33 + 0x800) >> 0xc);
    local_f8[6] = (int)((ulong)(lVar33 + lVar28 * 0xfffffffcc25 + 0x800 + lVar26 * 0xfffffffe6c3 +
                               lVar29) >> 0xc);
    lVar33 = (lVar34 + lVar30) * 0x292a;
    lVar15 = (lVar19 + lVar30) * 0x2234;
    lVar23 = (lVar30 + lVar21) * 0x1877;
    lVar17 = (lVar19 + lVar34) * -0x1877;
    local_f8[1] = (int)((ulong)(lVar33 + lVar30 * 0xfffffffc8f6 + 0x800 + lVar15 + lVar23 +
                               lVar31 * 0xcc0) >> 0xc);
    lVar26 = (lVar34 + lVar21) * -0x2ccb;
    local_f8[3] = (int)((ulong)(lVar34 * 0x28d8 + lVar33 + 0x800 + lVar17 + lVar26 +
                               lVar31 * 0xfffffffddcc) >> 0xc);
    lVar33 = (lVar19 + lVar21) * 0xcc0;
    local_f8[5] = (int)((ulong)(lVar31 * 0x2ccb + 0x800 +
                               lVar15 + lVar33 + lVar19 * -0x3fa6 + lVar17) >> 0xc);
    local_f8[7] = (int)((ulong)(lVar31 * 0xfffffffd6d6 + 0x800 +
                               lVar26 + lVar23 + lVar21 * 0x29c7 + lVar33) >> 0xc);
    piVar16 = local_98;
    if ((int)lVar18 != 7) {
      if ((int)lVar18 == 10) {
        lVar18 = 0;
        for (iVar20 = 7; -1 < iVar20; iVar20 = iVar20 + -1) {
          iVar2 = *(int *)((long)aiStack_58 + lVar18);
          iVar3 = *(int *)((long)data + lVar18);
          iVar4 = *(int *)((long)data + lVar18 + 0x20);
          lVar23 = (long)(iVar2 + iVar3);
          iVar5 = *(int *)((long)local_98 + lVar18);
          iVar6 = *(int *)((long)local_78 + lVar18);
          lVar19 = (long)(iVar6 + iVar4);
          iVar7 = *(int *)((long)data + lVar18 + 0x40);
          lVar33 = (long)(iVar5 + iVar7);
          iVar8 = *(int *)((long)data + lVar18 + 0x60);
          iVar9 = *(int *)((long)data + lVar18 + 0xe0);
          lVar17 = (long)(iVar8 + iVar9);
          iVar10 = *(int *)((long)data + lVar18 + 0x80);
          iVar11 = *(int *)((long)data + lVar18 + 0xc0);
          lVar21 = (long)(iVar11 + iVar10);
          lVar15 = (long)*(int *)((long)data + lVar18 + 0xa0);
          *(int *)((long)data + lVar18) =
               (int)((lVar33 + lVar17 + lVar19 + lVar23 + lVar21 + lVar15) * 0x21da + 0x4000U >> 0xf
                    );
          lVar23 = lVar23 + lVar15 * -2;
          lVar19 = lVar19 + lVar15 * -2;
          lVar33 = lVar33 + lVar15 * -2;
          lVar17 = lVar17 + lVar15 * -2;
          lVar21 = lVar21 + lVar15 * -2;
          lVar30 = (lVar33 + lVar21) * 0x6d0 + (lVar23 + lVar17) * 0x2def;
          lVar15 = (lVar19 - lVar17) * 0x1f5a;
          *(int *)((long)data + lVar18 + 0x40) =
               (int)(lVar21 * 0x7fffffffd0ea + lVar17 * 0x7fffffffdd87 + lVar15 + lVar30 + 0x4000U
                    >> 0xf);
          lVar17 = (lVar23 - lVar19) * 0x2846;
          *(int *)((long)data + lVar18 + 0x80) =
               (int)((ulong)(lVar33 * 0x7fffffffd211 + lVar21 * 0x13e3 + lVar15 +
                            lVar19 * 0x21c + lVar17 + 0x4000) >> 0xf);
          lVar29 = (long)(iVar3 - iVar2);
          lVar19 = (long)(iVar4 - iVar6);
          lVar26 = (long)(iVar7 - iVar5);
          lVar28 = (long)(iVar8 - iVar9);
          lVar21 = (long)(iVar10 - iVar11);
          *(int *)((long)data + lVar18 + 0xc0) =
               (int)((ulong)(lVar17 + lVar23 * 0x7fffffffc925 + 0x4000 + lVar33 * 0x7fffffffe54d +
                            lVar30) >> 0xf);
          lVar33 = (lVar19 + lVar29) * 0x2b8c;
          lVar23 = (lVar26 + lVar29) * 0x242e;
          lVar15 = (lVar29 + lVar28) * 0x19e2;
          lVar17 = (lVar26 + lVar19) * -0x19e2;
          *(int *)((long)data + lVar18 + 0x20) =
               (int)((ulong)(lVar33 + lVar29 * 0x7fffffffc5c7 + 0x4000 + lVar23 + lVar15 +
                            lVar21 * 0xd7d) >> 0xf);
          lVar29 = (lVar19 + lVar28) * -0x2f63;
          *(int *)((long)data + lVar18 + 0x60) =
               (int)((ulong)(lVar19 * 0x2b35 + lVar33 + 0x4000 + lVar17 + lVar29 +
                            lVar21 * 0x7fffffffdbd2) >> 0xf);
          lVar33 = (lVar26 + lVar28) * 0xd7d;
          *(int *)((long)data + lVar18 + 0xa0) =
               (int)((ulong)(lVar21 * 0x2f63 + 0x4000 + lVar23 + lVar33 + lVar26 * -0x4355 + lVar17)
                    >> 0xf);
          *(int *)((long)data + lVar18 + 0xe0) =
               (int)((ulong)(lVar21 * 0x7fffffffd474 + 0x4000 +
                            lVar29 + lVar15 + lVar28 * 0x2c32 + lVar33) >> 0xf);
          lVar18 = lVar18 + 4;
        }
        return;
      }
      piVar16 = local_f8 + 8;
    }
    lVar18 = lVar18 + 1;
    local_f8 = piVar16;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_11x11 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14;
  INT32 z1, z2, z3;
  DCTELEM workspace[8*3];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* we scale the results further by 2 as part of output adaption */
  /* scaling for different DCT size. */
  /* cK represents sqrt(2) * cos(K*pi/22). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[10]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[9]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[8]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[7]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[6]);
    tmp5 = GETJSAMPLE(elemptr[5]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[10]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[9]);
    tmp12 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[8]);
    tmp13 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[7]);
    tmp14 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[6]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 + tmp2 + tmp3 + tmp4 + tmp5 - 11 * CENTERJSAMPLE) << 1);
    tmp5 += tmp5;
    tmp0 -= tmp5;
    tmp1 -= tmp5;
    tmp2 -= tmp5;
    tmp3 -= tmp5;
    tmp4 -= tmp5;
    z1 = MULTIPLY(tmp0 + tmp3, FIX(1.356927976)) +       /* c2 */
	 MULTIPLY(tmp2 + tmp4, FIX(0.201263574));        /* c10 */
    z2 = MULTIPLY(tmp1 - tmp3, FIX(0.926112931));        /* c6 */
    z3 = MULTIPLY(tmp0 - tmp1, FIX(1.189712156));        /* c4 */
    dataptr[2] = (DCTELEM)
      DESCALE(z1 + z2 - MULTIPLY(tmp3, FIX(1.018300590)) /* c2+c8-c6 */
	      - MULTIPLY(tmp4, FIX(1.390975730)),        /* c4+c10 */
	      CONST_BITS-1);
    dataptr[4] = (DCTELEM)
      DESCALE(z2 + z3 + MULTIPLY(tmp1, FIX(0.062335650)) /* c4-c6-c10 */
	      - MULTIPLY(tmp2, FIX(1.356927976))         /* c2 */
	      + MULTIPLY(tmp4, FIX(0.587485545)),        /* c8 */
	      CONST_BITS-1);
    dataptr[6] = (DCTELEM)
      DESCALE(z1 + z3 - MULTIPLY(tmp0, FIX(1.620527200)) /* c2+c4-c6 */
	      - MULTIPLY(tmp2, FIX(0.788749120)),        /* c8+c10 */
	      CONST_BITS-1);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.286413905));    /* c3 */
    tmp2 = MULTIPLY(tmp10 + tmp12, FIX(1.068791298));    /* c5 */
    tmp3 = MULTIPLY(tmp10 + tmp13, FIX(0.764581576));    /* c7 */
    tmp0 = tmp1 + tmp2 + tmp3 - MULTIPLY(tmp10, FIX(1.719967871)) /* c7+c5+c3-c1 */
	   + MULTIPLY(tmp14, FIX(0.398430003));          /* c9 */
    tmp4 = MULTIPLY(tmp11 + tmp12, - FIX(0.764581576));  /* -c7 */
    tmp5 = MULTIPLY(tmp11 + tmp13, - FIX(1.399818907));  /* -c1 */
    tmp1 += tmp4 + tmp5 + MULTIPLY(tmp11, FIX(1.276416582)) /* c9+c7+c1-c3 */
	    - MULTIPLY(tmp14, FIX(1.068791298));         /* c5 */
    tmp10 = MULTIPLY(tmp12 + tmp13, FIX(0.398430003));   /* c9 */
    tmp2 += tmp4 + tmp10 - MULTIPLY(tmp12, FIX(1.989053629)) /* c9+c5+c3-c7 */
	    + MULTIPLY(tmp14, FIX(1.399818907));         /* c1 */
    tmp3 += tmp5 + tmp10 + MULTIPLY(tmp13, FIX(1.305598626)) /* c1+c5-c9-c7 */
	    - MULTIPLY(tmp14, FIX(1.286413905));         /* c3 */

    dataptr[1] = (DCTELEM) DESCALE(tmp0, CONST_BITS-1);
    dataptr[3] = (DCTELEM) DESCALE(tmp1, CONST_BITS-1);
    dataptr[5] = (DCTELEM) DESCALE(tmp2, CONST_BITS-1);
    dataptr[7] = (DCTELEM) DESCALE(tmp3, CONST_BITS-1);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 11)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/11)**2 = 64/121, which we partially
   * fold into the constant multipliers and final/initial shifting:
   * cK now represents sqrt(2) * cos(K*pi/22) * 128/121.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*2];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*1];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*0];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*7];
    tmp4 = dataptr[DCTSIZE*4] + dataptr[DCTSIZE*6];
    tmp5 = dataptr[DCTSIZE*5];

    tmp10 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*2];
    tmp11 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*1];
    tmp12 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*0];
    tmp13 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*7];
    tmp14 = dataptr[DCTSIZE*4] - dataptr[DCTSIZE*6];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 + tmp1 + tmp2 + tmp3 + tmp4 + tmp5,
		       FIX(1.057851240)),                /* 128/121 */
	      CONST_BITS+2);
    tmp5 += tmp5;
    tmp0 -= tmp5;
    tmp1 -= tmp5;
    tmp2 -= tmp5;
    tmp3 -= tmp5;
    tmp4 -= tmp5;
    z1 = MULTIPLY(tmp0 + tmp3, FIX(1.435427942)) +       /* c2 */
	 MULTIPLY(tmp2 + tmp4, FIX(0.212906922));        /* c10 */
    z2 = MULTIPLY(tmp1 - tmp3, FIX(0.979689713));        /* c6 */
    z3 = MULTIPLY(tmp0 - tmp1, FIX(1.258538479));        /* c4 */
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(z1 + z2 - MULTIPLY(tmp3, FIX(1.077210542)) /* c2+c8-c6 */
	      - MULTIPLY(tmp4, FIX(1.471445400)),        /* c4+c10 */
	      CONST_BITS+2);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(z2 + z3 + MULTIPLY(tmp1, FIX(0.065941844)) /* c4-c6-c10 */
	      - MULTIPLY(tmp2, FIX(1.435427942))         /* c2 */
	      + MULTIPLY(tmp4, FIX(0.621472312)),        /* c8 */
	      CONST_BITS+2);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(z1 + z3 - MULTIPLY(tmp0, FIX(1.714276708)) /* c2+c4-c6 */
	      - MULTIPLY(tmp2, FIX(0.834379234)),        /* c8+c10 */
	      CONST_BITS+2);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.360834544));    /* c3 */
    tmp2 = MULTIPLY(tmp10 + tmp12, FIX(1.130622199));    /* c5 */
    tmp3 = MULTIPLY(tmp10 + tmp13, FIX(0.808813568));    /* c7 */
    tmp0 = tmp1 + tmp2 + tmp3 - MULTIPLY(tmp10, FIX(1.819470145)) /* c7+c5+c3-c1 */
	   + MULTIPLY(tmp14, FIX(0.421479672));          /* c9 */
    tmp4 = MULTIPLY(tmp11 + tmp12, - FIX(0.808813568));  /* -c7 */
    tmp5 = MULTIPLY(tmp11 + tmp13, - FIX(1.480800167));  /* -c1 */
    tmp1 += tmp4 + tmp5 + MULTIPLY(tmp11, FIX(1.350258864)) /* c9+c7+c1-c3 */
	    - MULTIPLY(tmp14, FIX(1.130622199));         /* c5 */
    tmp10 = MULTIPLY(tmp12 + tmp13, FIX(0.421479672));   /* c9 */
    tmp2 += tmp4 + tmp10 - MULTIPLY(tmp12, FIX(2.104122847)) /* c9+c5+c3-c7 */
	    + MULTIPLY(tmp14, FIX(1.480800167));         /* c1 */
    tmp3 += tmp5 + tmp10 + MULTIPLY(tmp13, FIX(1.381129125)) /* c1+c5-c9-c7 */
	    - MULTIPLY(tmp14, FIX(1.360834544));         /* c3 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp0, CONST_BITS+2);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp1, CONST_BITS+2);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp2, CONST_BITS+2);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp3, CONST_BITS+2);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}